

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O0

void trial::protocol::core::detail::throw_failed_impl
               (char *expr,char *excep,char *file,int line,char *function)

{
  char *function_local;
  int line_local;
  char *file_local;
  char *excep_local;
  char *expr_local;
  
  boost::detail::throw_failed_impl(expr,excep,file,line,function);
  return;
}

Assistant:

inline void throw_failed_impl(const char *expr, const char *excep, const char *file, int line, const char *function)
{
#if BOOST_VERSION >= 107400
    ::boost::detail::throw_failed_impl(expr, excep, file, line, function);
#else
    (void)expr;
    ::boost::detail::throw_failed_impl(excep, file, line, function);
#endif
}